

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsSerializeParserState
          (JsValueRef scriptVal,JsValueRef *bufferVal,JsParseScriptAttributes parseAttributes)

{
  uchar *buffer_00;
  byte *buffer;
  JsErrorCode local_40;
  uint bufferSize;
  JsErrorCode errorCode;
  LoadScriptFlag scriptFlag;
  size_t cb;
  byte *script;
  JsValueRef *ppvStack_20;
  JsParseScriptAttributes parseAttributes_local;
  JsValueRef *bufferVal_local;
  JsValueRef scriptVal_local;
  
  if (scriptVal == (JsValueRef)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else if (bufferVal == (JsValueRef *)0x0) {
    scriptVal_local._4_4_ = JsErrorNullArgument;
  }
  else if (scriptVal == (JsValueRef)0x0) {
    scriptVal_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    *bufferVal = (JsValueRef)0x0;
    cb = 0;
    _errorCode = 0;
    bufferSize = 0;
    script._4_4_ = parseAttributes;
    ppvStack_20 = bufferVal;
    bufferVal_local = (JsValueRef *)scriptVal;
    local_40 = GetScriptBufferDetails
                         (scriptVal,parseAttributes,&bufferSize,(size_t *)&errorCode,(byte **)&cb);
    scriptVal_local._4_4_ = local_40;
    if (local_40 == JsNoError) {
      buffer._4_4_ = 0;
      local_40 = JsSerializeParserStateCore
                           ((byte *)cb,_errorCode,bufferSize,(uchar *)0x0,
                            (uint *)((long)&buffer + 4));
      scriptVal_local._4_4_ = local_40;
      if (local_40 == JsNoError) {
        if (buffer._4_4_ == 0) {
          scriptVal_local._4_4_ = JsErrorScriptCompile;
        }
        else {
          local_40 = JsCreateArrayBuffer(buffer._4_4_,ppvStack_20);
          if (local_40 == JsNoError) {
            buffer_00 = (uchar *)(**(code **)(**ppvStack_20 + 0x390))();
            local_40 = JsSerializeParserStateCore
                                 ((byte *)cb,_errorCode,bufferSize,buffer_00,
                                  (uint *)((long)&buffer + 4));
          }
          scriptVal_local._4_4_ = local_40;
        }
      }
    }
  }
  return scriptVal_local._4_4_;
}

Assistant:

CHAKRA_API JsSerializeParserState(
    _In_ JsValueRef scriptVal,
    _Out_ JsValueRef *bufferVal,
    _In_ JsParseScriptAttributes parseAttributes)
{
    PARAM_NOT_NULL(scriptVal);
    PARAM_NOT_NULL(bufferVal);
    VALIDATE_JSREF(scriptVal);

    *bufferVal = nullptr;

    const byte* script = nullptr;
    size_t cb = 0;
    LoadScriptFlag scriptFlag = LoadScriptFlag_None;

    JsErrorCode errorCode = GetScriptBufferDetails(scriptVal, parseAttributes,
        &scriptFlag, &cb, &script);

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    unsigned int bufferSize = 0;
    errorCode = JsSerializeParserStateCore(script, cb, scriptFlag, nullptr,
        &bufferSize);

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    if (bufferSize == 0)
    {
        return JsErrorScriptCompile;
    }

    if ((errorCode = JsCreateArrayBuffer(bufferSize, bufferVal)) == JsNoError)
    {
        byte* buffer = ((Js::ArrayBuffer*)(*bufferVal))->GetBuffer();
        errorCode = JsSerializeParserStateCore(script, cb, scriptFlag, buffer,
            &bufferSize);
    }

    return errorCode;
}